

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvmapImage.cpp
# Opt level: O2

void __thiscall EnvmapImage::EnvmapImage(EnvmapImage *this,Envmap type,Box2i *dataWindow)

{
  int iVar1;
  int iVar2;
  
  this->_type = type;
  (this->_dataWindow).min = dataWindow->min;
  iVar1 = (dataWindow->max).x;
  (this->_dataWindow).max.x = iVar1;
  iVar2 = (dataWindow->max).y;
  (this->_dataWindow).max.y = iVar2;
  Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D
            (&this->_pixels,(long)((iVar2 - (dataWindow->min).y) + 1),
             (long)((iVar1 - (dataWindow->min).x) + 1));
  clear(this);
  return;
}

Assistant:

EnvmapImage::EnvmapImage (Envmap type, const Box2i& dataWindow)
    : _type (type)
    , _dataWindow (dataWindow)
    , _pixels (
          dataWindow.max.y - dataWindow.min.y + 1,
          dataWindow.max.x - dataWindow.min.x + 1)
{
    clear ();
}